

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

void __thiscall CompilationContext::inverseWarningsSuppression(CompilationContext *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t j;
  bool found;
  int i;
  vector<int,_std::allocator<int>_> newSuppressWarnings;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  ulong local_30;
  uint local_24;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x108e6d);
  local_24 = 0;
  do {
    if (0x58 < local_24) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&this->suppressWarnings,
                 (vector<int,_std::allocator<int>_> *)
                 newSuppressWarnings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
      return;
    }
    bVar2 = false;
    local_30 = 0;
    while( true ) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
      if (sVar3 <= local_30) break;
      iVar1 = analyzer_messages[(int)local_24].intId;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,local_30);
      if (iVar1 == *pvVar4) {
        bVar2 = true;
        break;
      }
      local_30 = local_30 + 1;
    }
    if (!bVar2) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type *)in_RDI);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void CompilationContext::inverseWarningsSuppression()
{
  std::vector<int> newSuppressWarnings;
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
  {
    bool found = false;
    for (size_t j = 0; j < suppressWarnings.size(); j++)
    {
      if (analyzer_messages[i].intId == suppressWarnings[j])
      {
        found = true;
        break;
      }
    }

    if (!found)
      newSuppressWarnings.push_back(analyzer_messages[i].intId);
  }

  suppressWarnings = newSuppressWarnings;
}